

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O0

StridedArrayView<1U,_const_unsigned_long_long> * __thiscall
Corrade::Containers::arrayCast<unsigned_long_long_const,1u,unsigned_long_const>
          (StridedArrayView<1U,_const_unsigned_long_long> *__return_storage_ptr__,Containers *this,
          StridedArrayView<1U,_const_unsigned_long> *view)

{
  ostream *output;
  Debug *pDVar1;
  ulong local_70;
  Flags local_41;
  Error local_40;
  uint local_14;
  Containers *pCStack_10;
  uint i;
  StridedArrayView<1U,_const_unsigned_long> *view_local;
  
  local_14 = 0;
  do {
    pCStack_10 = this;
    if (local_14 == 1) {
      StridedArrayView<1U,_const_unsigned_long_long>::StridedArrayView
                (__return_storage_ptr__,(Size<1U> *)(this + 8),(Stride<1U> *)(this + 0x10),
                 *(ErasedType **)this);
      return __return_storage_ptr__;
    }
    if (*(long *)(this + (ulong)local_14 * 8 + 0x10) != 0) {
      if (*(long *)(this + (ulong)local_14 * 8 + 0x10) < 0) {
        local_70 = -*(long *)(this + (ulong)local_14 * 8 + 0x10);
      }
      else {
        local_70 = *(ulong *)(this + (ulong)local_14 * 8 + 0x10);
      }
      if (local_70 < 8) {
        output = Utility::Error::defaultOutput();
        EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
        Utility::Error::Error(&local_40,output,local_41);
        pDVar1 = Utility::Debug::operator<<
                           (&local_40.super_Debug,"Containers::arrayCast(): can\'t fit a");
        pDVar1 = Utility::Debug::operator<<(pDVar1,8);
        pDVar1 = Utility::Debug::operator<<(pDVar1,Utility::Debug::nospace);
        pDVar1 = Utility::Debug::operator<<(pDVar1,"-byte type into a stride of");
        Utility::Debug::operator<<(pDVar1,*(long *)(pCStack_10 + (ulong)local_14 * 8 + 0x10));
        Utility::Error::~Error(&local_40);
        abort();
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

StridedArrayView<dimensions, U> arrayCast(const StridedArrayView<dimensions, T>& view) {
    static_assert(std::is_standard_layout<T>::value, "the source type is not standard layout");
    static_assert(std::is_standard_layout<U>::value, "the target type is not standard layout");
    #ifndef CORRADE_NO_ASSERT
    for(unsigned i = 0; i != dimensions; ++i) {
        /* Unlike slice() etc, this is usually not called in tight loops and
           should be as checked as possible, so it's not a debug assert */
        CORRADE_ASSERT(!view._stride._data[i] || sizeof(U) <= std::size_t(view._stride._data[i] < 0 ? -view._stride._data[i] : view._stride._data[i]),
            "Containers::arrayCast(): can't fit a" << sizeof(U) << Utility::Debug::nospace << "-byte type into a stride of" << view._stride._data[i], {});
    }
    #endif
    return StridedArrayView<dimensions, U>{view._size, view._stride, view._data};
}